

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::TokenManager::Init
          (Error *__return_storage_ptr__,TokenManager *this,Config *aConfig)

{
  ErrorCode EVar1;
  Error *pEVar2;
  TokenManager *pTVar3;
  mbedtls_pk_context trustAnchorPublicKey;
  mbedtls_pk_context privateKey;
  mbedtls_pk_context publicKey;
  mbedtls_pk_context_conflict mStack_f8;
  mbedtls_pk_context_conflict local_e0;
  mbedtls_pk_context_conflict local_c8;
  undefined1 local_b0 [104];
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pTVar3 = this;
  mbedtls_pk_init(&local_c8);
  mbedtls_pk_init(&local_e0);
  mbedtls_pk_init(&mStack_f8);
  ParsePublicKey((Error *)local_b0,pTVar3,(mbedtls_pk_context *)&local_c8,&aConfig->mCertificate);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_b0);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_b0 + 8));
  if (EVar1 == kNone) {
    ParsePrivateKey((Error *)local_b0,this,(mbedtls_pk_context *)&local_e0,&aConfig->mPrivateKey);
    pTVar3 = (TokenManager *)local_b0;
    pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)pTVar3);
    EVar1 = pEVar2->mCode;
    std::__cxx11::string::~string((string *)(local_b0 + 8));
    if (EVar1 == kNone) {
      ParsePublicKey((Error *)local_b0,pTVar3,(mbedtls_pk_context *)&mStack_f8,
                     &aConfig->mTrustAnchor);
      pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_b0);
      EVar1 = pEVar2->mCode;
      std::__cxx11::string::~string((string *)(local_b0 + 8));
      if (EVar1 == kNone) {
        GetDtlsConfig((DtlsConfig *)local_b0,aConfig);
        DtlsSession::Init((Error *)local_48,&(this->mRegistrarClient).mDtlsSession,
                          (DtlsConfig *)local_b0);
        pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
        EVar1 = pEVar2->mCode;
        std::__cxx11::string::~string((string *)(local_48 + 8));
        DtlsConfig::~DtlsConfig((DtlsConfig *)local_b0);
        if (EVar1 == kNone) {
          std::__cxx11::string::_M_assign((string *)&this->mCommissionerId);
          std::__cxx11::string::_M_assign((string *)&this->mDomainName);
          MoveMbedtlsKey(&this->mPublicKey,(mbedtls_pk_context *)&local_c8);
          MoveMbedtlsKey(&this->mPrivateKey,(mbedtls_pk_context *)&local_e0);
          MoveMbedtlsKey(&this->mDomainCAPublicKey,(mbedtls_pk_context *)&mStack_f8);
        }
      }
    }
  }
  mbedtls_pk_free(&mStack_f8);
  mbedtls_pk_free(&local_e0);
  mbedtls_pk_free(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::Init(const Config &aConfig)
{
    Error              error;
    mbedtls_pk_context publicKey;
    mbedtls_pk_context privateKey;
    mbedtls_pk_context trustAnchorPublicKey;

    mbedtls_pk_init(&publicKey);
    mbedtls_pk_init(&privateKey);
    mbedtls_pk_init(&trustAnchorPublicKey);

    SuccessOrExit(error = ParsePublicKey(publicKey, aConfig.mCertificate));
    SuccessOrExit(error = ParsePrivateKey(privateKey, aConfig.mPrivateKey));
    SuccessOrExit(error = ParsePublicKey(trustAnchorPublicKey, aConfig.mTrustAnchor));

    SuccessOrExit(error = mRegistrarClient.Init(GetDtlsConfig(aConfig)));

    mCommissionerId = aConfig.mId;
    mDomainName     = aConfig.mDomainName;

    // Move mbedtls keys
    MoveMbedtlsKey(mPublicKey, publicKey);
    MoveMbedtlsKey(mPrivateKey, privateKey);
    MoveMbedtlsKey(mDomainCAPublicKey, trustAnchorPublicKey);

exit:
    mbedtls_pk_free(&trustAnchorPublicKey);
    mbedtls_pk_free(&privateKey);
    mbedtls_pk_free(&publicKey);
    return error;
}